

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LogManager.cpp
# Opt level: O3

void __thiscall
helics::LogManager::addLoggingCLI(LogManager *this,shared_ptr<helics::helicsCLI11App> *app)

{
  element_type *this_00;
  App *pAVar1;
  Option *pOVar2;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v11::context>_2 in_R9;
  vector<CLI::Validator,_std::allocator<CLI::Validator>_> *pvVar3;
  string_view fmt;
  format_args args;
  long *local_800;
  long local_7f8;
  long local_7f0 [2];
  _Any_data local_7e0;
  _Manager_type local_7d0;
  code *local_7c8;
  _Any_data local_7c0;
  _Manager_type local_7b0;
  undefined8 uStack_7a8;
  _Any_data local_7a0;
  code *local_790;
  undefined8 uStack_788;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_780;
  undefined8 local_778;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_770;
  undefined4 local_760;
  undefined2 local_75c;
  _Any_data local_758;
  code *local_748;
  undefined8 uStack_740;
  _Any_data local_738;
  code *local_728;
  undefined8 uStack_720;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_718;
  undefined8 local_710;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_708;
  undefined4 local_6f8;
  undefined2 local_6f4;
  App *local_6f0;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  *local_6e8;
  undefined1 *local_6e0 [2];
  undefined1 local_6d0 [16];
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  *local_6c0;
  long local_6b8;
  undefined1 local_6b0 [16];
  function<void_(long)> local_6a0;
  string local_680;
  string local_660;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_640;
  string local_620;
  _Any_data local_600;
  code *local_5f0;
  code *local_5e8;
  pointer local_5e0;
  string local_5d8;
  string local_5b8;
  string local_598;
  string local_578;
  _Any_data local_558;
  code *local_548;
  undefined8 local_540;
  _Any_data local_538;
  code *local_528;
  undefined8 local_520;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_518;
  undefined8 local_510;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_508;
  undefined4 local_4f8;
  undefined2 local_4f4;
  _Any_data local_4e8;
  code *local_4d8;
  undefined8 local_4d0;
  _Any_data local_4c8;
  code *local_4b8;
  undefined8 local_4b0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_4a8;
  undefined8 local_4a0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_498;
  undefined4 local_488;
  undefined2 local_484;
  _Any_data local_478;
  _Manager_type local_468;
  undefined8 local_460;
  _Any_data local_458;
  code *local_448;
  undefined8 local_440;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_438;
  undefined8 local_430;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_428;
  undefined4 local_418;
  undefined2 local_414;
  _Any_data local_408;
  code *local_3f8;
  undefined8 local_3f0;
  _Any_data local_3e8;
  code *local_3d8;
  undefined8 local_3d0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_3c8;
  undefined8 local_3c0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_3b8;
  undefined4 local_3a8;
  undefined2 local_3a4;
  _Any_data local_398;
  _Manager_type local_388;
  undefined8 local_380;
  _Any_data local_378;
  code *local_368;
  undefined8 local_360;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_358;
  undefined8 local_350;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_348;
  undefined4 local_338;
  undefined2 local_334;
  _Any_data local_328;
  _Manager_type local_318;
  undefined8 local_310;
  _Any_data local_308;
  code *local_2f8;
  undefined8 local_2f0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_2e8;
  undefined8 local_2e0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2d8;
  undefined4 local_2c8;
  undefined2 local_2c4;
  string local_2b8;
  string local_298;
  string local_278;
  string local_258;
  string local_238;
  string local_218;
  string local_1f8;
  filter_fn_t local_1d8;
  filter_fn_t local_1b8;
  filter_fn_t local_198;
  filter_fn_t local_178;
  filter_fn_t local_158;
  filter_fn_t local_138;
  filter_fn_t local_118;
  filter_fn_t local_f8;
  filter_fn_t local_d8;
  filter_fn_t local_b8;
  filter_fn_t local_98;
  filter_fn_t local_78;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  *local_58;
  _Any_data local_50;
  code *local_40;
  code *local_38;
  
  this_00 = (app->super___shared_ptr<helics::helicsCLI11App,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  local_218._M_dataplus._M_p = (pointer)&local_218.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_218,"logging","");
  local_578._M_dataplus._M_p = (pointer)&local_578.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_578,"Options related to file and message logging","");
  pAVar1 = &CLI::App::add_option_group<CLI::Option_group>(&this_00->super_App,&local_218,&local_578)
            ->super_App;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_578._M_dataplus._M_p != &local_578.field_2) {
    operator_delete(local_578._M_dataplus._M_p,local_578.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_218._M_dataplus._M_p != &local_218.field_2) {
    operator_delete(local_218._M_dataplus._M_p,local_218.field_2._M_allocated_capacity + 1);
  }
  local_238._M_dataplus._M_p = (pointer)&local_238.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_238,"--force_logging_flush","");
  local_600._8_8_ = 0;
  local_5e8 = CLI::std::
              _Function_handler<void_(long),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/core/LogManager.cpp:161:9)>
              ::_M_invoke;
  local_5f0 = CLI::std::
              _Function_handler<void_(long),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/core/LogManager.cpp:161:9)>
              ::_M_manager;
  local_600._M_unused._M_object = this;
  local_598._M_dataplus._M_p = (pointer)&local_598.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_598,"flush the log after every message","");
  CLI::App::add_flag_function(pAVar1,&local_238,(function<void_(long)> *)&local_600,&local_598);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_598._M_dataplus._M_p != &local_598.field_2) {
    operator_delete(local_598._M_dataplus._M_p,local_598.field_2._M_allocated_capacity + 1);
  }
  if (local_5f0 != (code *)0x0) {
    (*local_5f0)(&local_600,&local_600,__destroy_functor);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_238._M_dataplus._M_p != &local_238.field_2) {
    operator_delete(local_238._M_dataplus._M_p,local_238.field_2._M_allocated_capacity + 1);
  }
  local_258._M_dataplus._M_p = (pointer)&local_258.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_258,"--logfile","");
  local_5b8._M_dataplus._M_p = (pointer)&local_5b8.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_5b8,"the file to log the messages to","");
  CLI::App::
  add_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(CLI::detail::enabler)0>
            (pAVar1,&local_258,&this->logFile,&local_5b8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5b8._M_dataplus._M_p != &local_5b8.field_2) {
    operator_delete(local_5b8._M_dataplus._M_p,local_5b8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_258._M_dataplus._M_p != &local_258.field_2) {
    operator_delete(local_258._M_dataplus._M_p,local_258.field_2._M_allocated_capacity + 1);
  }
  local_278._M_dataplus._M_p = (pointer)&local_278.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_278,"--loglevel","");
  local_7e0._8_8_ = 0;
  local_7c8 = CLI::std::
              _Function_handler<void_(const_int_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/core/LogManager.cpp:171:13)>
              ::_M_invoke;
  local_7d0 = CLI::std::
              _Function_handler<void_(const_int_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/core/LogManager.cpp:171:13)>
              ::_M_manager;
  local_620._M_dataplus._M_p = (pointer)&local_620.field_2;
  local_7e0._M_unused._M_object = this;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_620,
             "the level at which to log, the higher this is set the more gets logged; set to \"no_print\" for no logging"
             ,"");
  local_6f0 = pAVar1;
  pOVar2 = CLI::App::add_option_function<int>
                     (pAVar1,&local_278,(function<void_(const_int_&)> *)&local_7e0,&local_620);
  local_640._M_dataplus._M_p = (pointer)&local_640.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_640,"HELICS_BROKER_LOG_LEVEL","")
  ;
  CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
            (&pOVar2->envname_,&local_640);
  local_6e8 = (unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
               *)gLogLevelMap_abi_cxx11_;
  local_78.super__Function_base._M_functor._8_8_ = 0;
  local_78.super__Function_base._M_functor._M_unused._M_object = CLI::ignore_case;
  local_78._M_invoker =
       CLI::std::
       _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(*)(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
       ::_M_invoke;
  local_78.super__Function_base._M_manager =
       CLI::std::
       _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(*)(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
       ::_M_manager;
  local_98.super__Function_base._M_functor._8_8_ = 0;
  local_98.super__Function_base._M_functor._M_unused._M_object = CLI::ignore_underscore;
  local_98._M_invoker =
       CLI::std::
       _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(*)(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
       ::_M_invoke;
  local_98.super__Function_base._M_manager =
       CLI::std::
       _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(*)(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
       ::_M_manager;
  CLI::CheckedTransformer::
  CheckedTransformer<std::unordered_map<std::__cxx11::string,int,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,int>>>const*>
            ((CheckedTransformer *)&local_758,&local_6e8,&local_78,&local_98);
  local_4e8._M_unused._M_object = (void *)0x0;
  local_4e8._8_8_ = 0;
  local_4d8 = (code *)0x0;
  local_4d0 = uStack_740;
  if (local_748 != (code *)0x0) {
    local_4e8._M_unused._M_object = local_758._M_unused._M_object;
    local_4e8._8_8_ = local_758._8_8_;
    local_4d8 = local_748;
    local_748 = (code *)0x0;
    uStack_740 = 0;
  }
  local_4c8._M_unused._M_object = (void *)0x0;
  local_4c8._8_8_ = 0;
  local_4b8 = (code *)0x0;
  local_4b0 = uStack_720;
  if (local_728 != (code *)0x0) {
    local_4c8._M_unused._M_object = local_738._M_unused._M_object;
    local_4c8._8_8_ = local_738._8_8_;
    local_4b8 = local_728;
    local_728 = (code *)0x0;
    uStack_720 = 0;
  }
  local_4a8 = &local_498;
  if (local_718 == &local_708) {
    local_498._8_4_ = local_708._8_4_;
    local_498._12_4_ = local_708._12_4_;
  }
  else {
    local_4a8 = local_718;
  }
  local_498._M_allocated_capacity._4_4_ = local_708._M_allocated_capacity._4_4_;
  local_498._M_allocated_capacity._0_4_ = local_708._M_allocated_capacity._0_4_;
  local_4a0 = local_710;
  local_710 = 0;
  local_708._M_allocated_capacity._0_4_ = local_708._M_allocated_capacity._0_4_ & 0xffffff00;
  local_488 = local_6f8;
  local_484 = local_6f4;
  local_800 = local_7f0;
  local_718 = &local_708;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_800,"");
  pvVar3 = &pOVar2->validators_;
  CLI::std::vector<CLI::Validator,_std::allocator<CLI::Validator>_>::_M_insert_rval
            (pvVar3,(pOVar2->validators_).
                    super__Vector_base<CLI::Validator,_std::allocator<CLI::Validator>_>._M_impl.
                    super__Vector_impl_data._M_start,(value_type *)&local_4e8);
  if (local_7f8 != 0) {
    local_7c0._M_unused._M_object = &local_7b0;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_7c0,local_800,local_7f8 + (long)local_800);
    addLoggingCLI();
  }
  local_58 = (unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
              *)gLogLevelMap_abi_cxx11_;
  local_b8.super__Function_base._M_functor._8_8_ = 0;
  local_b8.super__Function_base._M_functor._M_unused._M_object = CLI::ignore_case;
  local_b8._M_invoker =
       CLI::std::
       _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(*)(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
       ::_M_invoke;
  local_b8.super__Function_base._M_manager =
       CLI::std::
       _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(*)(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
       ::_M_manager;
  local_d8.super__Function_base._M_functor._8_8_ = 0;
  local_d8.super__Function_base._M_functor._M_unused._M_object = CLI::ignore_underscore;
  local_d8._M_invoker =
       CLI::std::
       _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(*)(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
       ::_M_invoke;
  local_d8.super__Function_base._M_manager =
       CLI::std::
       _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(*)(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
       ::_M_manager;
  CLI::IsMember::
  IsMember<std::unordered_map<std::__cxx11::string,int,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,int>>>const*>
            ((IsMember *)&local_7c0,&local_58,&local_b8,&local_d8);
  local_328._M_unused._M_object = (_Manager_type *)0x0;
  local_328._8_8_ = 0;
  local_318 = (_Manager_type)0x0;
  local_310 = uStack_7a8;
  if (local_7b0 != (_Manager_type)0x0) {
    local_328._M_unused._M_object = local_7c0._M_unused._M_object;
    local_328._8_8_ = local_7c0._8_8_;
    local_318 = local_7b0;
    local_7b0 = (_Manager_type)0x0;
    uStack_7a8 = 0;
  }
  local_308._M_unused._M_object = (void *)0x0;
  local_308._8_8_ = 0;
  local_2f8 = (code *)0x0;
  local_2f0 = uStack_788;
  if (local_790 != (code *)0x0) {
    local_308._M_unused._M_object = local_7a0._M_unused._M_object;
    local_308._8_8_ = local_7a0._8_8_;
    local_2f8 = local_790;
    local_790 = (code *)0x0;
    uStack_788 = 0;
  }
  if (local_780 == &local_770) {
    local_2d8._8_4_ = local_770._8_4_;
    local_2d8._12_4_ = local_770._12_4_;
    local_2e8 = &local_2d8;
  }
  else {
    local_2e8 = local_780;
  }
  local_2d8._M_allocated_capacity._4_4_ = local_770._M_allocated_capacity._4_4_;
  local_2d8._M_allocated_capacity._0_4_ = local_770._M_allocated_capacity._0_4_;
  local_2e0 = local_778;
  local_778 = 0;
  local_770._M_allocated_capacity._0_4_ = local_770._M_allocated_capacity._0_4_ & 0xffffff00;
  local_2c8 = local_760;
  local_2c4 = local_75c;
  local_780 = &local_770;
  local_6c0 = (unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
               *)local_6b0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_6c0,"");
  CLI::std::vector<CLI::Validator,_std::allocator<CLI::Validator>_>::_M_insert_rval
            (pvVar3,(pvVar3->super__Vector_base<CLI::Validator,_std::allocator<CLI::Validator>_>).
                    _M_impl.super__Vector_impl_data._M_start,(value_type *)&local_328);
  if (local_6b8 != 0) {
    local_6e0[0] = local_6d0;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_6e0,local_6c0,
               (undefined1 *)((long)&(local_6c0->_M_h)._M_buckets + local_6b8));
    addLoggingCLI();
  }
  if (local_6c0 !=
      (unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
       *)local_6b0) {
    operator_delete(local_6c0,local_6b0._0_8_ + 1);
  }
  pAVar1 = local_6f0;
  if (local_2e8 != &local_2d8) {
    operator_delete(local_2e8,local_2d8._M_allocated_capacity + 1);
  }
  if (local_2f8 != (code *)0x0) {
    (*local_2f8)(&local_308,&local_308,__destroy_functor);
  }
  if (local_318 != (_Manager_type)0x0) {
    (*local_318)(&local_328,&local_328,__destroy_functor);
  }
  if (local_780 != &local_770) {
    operator_delete(local_780,
                    CONCAT44(local_770._M_allocated_capacity._4_4_,
                             local_770._M_allocated_capacity._0_4_) + 1);
  }
  if (local_790 != (code *)0x0) {
    (*local_790)(&local_7a0,&local_7a0,__destroy_functor);
  }
  if (local_7b0 != (_Manager_type)0x0) {
    (*local_7b0)(&local_7c0,&local_7c0,__destroy_functor);
  }
  if (local_d8.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_d8.super__Function_base._M_manager)
              ((_Any_data *)&local_d8,(_Any_data *)&local_d8,__destroy_functor);
  }
  if (local_b8.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_b8.super__Function_base._M_manager)
              ((_Any_data *)&local_b8,(_Any_data *)&local_b8,__destroy_functor);
  }
  if (local_800 != local_7f0) {
    operator_delete(local_800,local_7f0[0] + 1);
  }
  if (local_4a8 != &local_498) {
    operator_delete(local_4a8,local_498._M_allocated_capacity + 1);
  }
  if (local_4b8 != (code *)0x0) {
    (*local_4b8)(&local_4c8,&local_4c8,__destroy_functor);
  }
  if (local_4d8 != (code *)0x0) {
    (*local_4d8)(&local_4e8,&local_4e8,__destroy_functor);
  }
  if (local_718 != &local_708) {
    operator_delete(local_718,
                    CONCAT44(local_708._M_allocated_capacity._4_4_,
                             local_708._M_allocated_capacity._0_4_) + 1);
  }
  if (local_728 != (code *)0x0) {
    (*local_728)(&local_738,&local_738,__destroy_functor);
  }
  if (local_748 != (code *)0x0) {
    (*local_748)(&local_758,&local_758,__destroy_functor);
  }
  if (local_98.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_98.super__Function_base._M_manager)
              ((_Any_data *)&local_98,(_Any_data *)&local_98,__destroy_functor);
  }
  if (local_78.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_78.super__Function_base._M_manager)
              ((_Any_data *)&local_78,(_Any_data *)&local_78,__destroy_functor);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_640._M_dataplus._M_p != &local_640.field_2) {
    operator_delete(local_640._M_dataplus._M_p,local_640.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_620._M_dataplus._M_p != &local_620.field_2) {
    operator_delete(local_620._M_dataplus._M_p,local_620.field_2._M_allocated_capacity + 1);
  }
  if (local_7d0 != (_Manager_type)0x0) {
    (*local_7d0)(&local_7e0,&local_7e0,__destroy_functor);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_278._M_dataplus._M_p != &local_278.field_2) {
    operator_delete(local_278._M_dataplus._M_p,local_278.field_2._M_allocated_capacity + 1);
  }
  local_298._M_dataplus._M_p = (pointer)&local_298.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_298,"--fileloglevel","");
  local_660._M_dataplus._M_p = (pointer)&local_660.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_660,"the level at which messages get sent to the file","");
  pOVar2 = CLI::App::add_option<int,_int,_(CLI::detail::enabler)0>
                     (pAVar1,&local_298,&this->fileLogLevel,&local_660);
  local_6c0 = (unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
               *)gLogLevelMap_abi_cxx11_;
  local_f8.super__Function_base._M_functor._8_8_ = 0;
  local_f8.super__Function_base._M_functor._M_unused._M_object = CLI::ignore_case;
  local_f8._M_invoker =
       CLI::std::
       _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(*)(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
       ::_M_invoke;
  local_f8.super__Function_base._M_manager =
       CLI::std::
       _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(*)(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
       ::_M_manager;
  local_118.super__Function_base._M_functor._8_8_ = 0;
  local_118.super__Function_base._M_functor._M_unused._M_object = CLI::ignore_underscore;
  local_118._M_invoker =
       CLI::std::
       _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(*)(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
       ::_M_invoke;
  local_118.super__Function_base._M_manager =
       CLI::std::
       _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(*)(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
       ::_M_manager;
  CLI::CheckedTransformer::
  CheckedTransformer<std::unordered_map<std::__cxx11::string,int,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,int>>>const*>
            ((CheckedTransformer *)&local_758,&local_6c0,&local_f8,&local_118);
  local_558._M_unused._M_object = (void *)0x0;
  local_558._8_8_ = 0;
  local_548 = (code *)0x0;
  local_540 = uStack_740;
  if (local_748 != (code *)0x0) {
    local_558._M_unused._M_object = local_758._M_unused._M_object;
    local_558._8_8_ = local_758._8_8_;
    local_548 = local_748;
    local_748 = (code *)0x0;
    uStack_740 = 0;
  }
  local_538._M_unused._M_object = (void *)0x0;
  local_538._8_8_ = 0;
  local_528 = (code *)0x0;
  local_520 = uStack_720;
  if (local_728 != (code *)0x0) {
    local_538._M_unused._M_object = local_738._M_unused._M_object;
    local_538._8_8_ = local_738._8_8_;
    local_528 = local_728;
    local_728 = (code *)0x0;
    uStack_720 = 0;
  }
  local_518 = &local_508;
  if (local_718 == &local_708) {
    local_508._8_4_ = local_708._8_4_;
    local_508._12_4_ = local_708._12_4_;
  }
  else {
    local_518 = local_718;
  }
  local_508._M_allocated_capacity._4_4_ = local_708._M_allocated_capacity._4_4_;
  local_508._M_allocated_capacity._0_4_ = local_708._M_allocated_capacity._0_4_;
  local_510 = local_710;
  local_710 = 0;
  local_708._M_allocated_capacity._0_4_ = local_708._M_allocated_capacity._0_4_ & 0xffffff00;
  local_4f8 = local_6f8;
  local_4f4 = local_6f4;
  local_7e0._M_unused._M_object = &local_7d0;
  local_718 = &local_708;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_7e0,"");
  pvVar3 = &pOVar2->validators_;
  CLI::std::vector<CLI::Validator,_std::allocator<CLI::Validator>_>::_M_insert_rval
            (pvVar3,(pOVar2->validators_).
                    super__Vector_base<CLI::Validator,_std::allocator<CLI::Validator>_>._M_impl.
                    super__Vector_impl_data._M_start,(value_type *)&local_558);
  if (local_7e0._8_8_ != 0) {
    local_7c0._M_unused._M_object = &local_7b0;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_7c0,local_7e0._M_unused._M_object,
               local_7e0._8_8_ + (long)local_7e0._M_unused._0_8_);
    addLoggingCLI();
  }
  local_6e8 = (unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
               *)gLogLevelMap_abi_cxx11_;
  local_138.super__Function_base._M_functor._8_8_ = 0;
  local_138.super__Function_base._M_functor._M_unused._M_object = CLI::ignore_case;
  local_138._M_invoker =
       CLI::std::
       _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(*)(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
       ::_M_invoke;
  local_138.super__Function_base._M_manager =
       CLI::std::
       _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(*)(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
       ::_M_manager;
  local_158.super__Function_base._M_functor._8_8_ = 0;
  local_158.super__Function_base._M_functor._M_unused._M_object = CLI::ignore_underscore;
  local_158._M_invoker =
       CLI::std::
       _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(*)(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
       ::_M_invoke;
  local_158.super__Function_base._M_manager =
       CLI::std::
       _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(*)(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
       ::_M_manager;
  CLI::IsMember::
  IsMember<std::unordered_map<std::__cxx11::string,int,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,int>>>const*>
            ((IsMember *)&local_7c0,&local_6e8,&local_138,&local_158);
  local_398._M_unused._M_object = (_Manager_type *)0x0;
  local_398._8_8_ = 0;
  local_388 = (_Manager_type)0x0;
  local_380 = uStack_7a8;
  if (local_7b0 != (_Manager_type)0x0) {
    local_398._M_unused._M_object = local_7c0._M_unused._M_object;
    local_398._8_8_ = local_7c0._8_8_;
    local_388 = local_7b0;
    local_7b0 = (_Manager_type)0x0;
    uStack_7a8 = 0;
  }
  local_378._M_unused._M_object = (void *)0x0;
  local_378._8_8_ = 0;
  local_368 = (code *)0x0;
  local_360 = uStack_788;
  if (local_790 != (code *)0x0) {
    local_378._M_unused._M_object = local_7a0._M_unused._M_object;
    local_378._8_8_ = local_7a0._8_8_;
    local_368 = local_790;
    local_790 = (code *)0x0;
    uStack_788 = 0;
  }
  if (local_780 == &local_770) {
    local_348._8_4_ = local_770._8_4_;
    local_348._12_4_ = local_770._12_4_;
    local_358 = &local_348;
  }
  else {
    local_358 = local_780;
  }
  local_348._M_allocated_capacity._4_4_ = local_770._M_allocated_capacity._4_4_;
  local_348._M_allocated_capacity._0_4_ = local_770._M_allocated_capacity._0_4_;
  local_350 = local_778;
  local_778 = 0;
  local_770._M_allocated_capacity._0_4_ = local_770._M_allocated_capacity._0_4_ & 0xffffff00;
  local_338 = local_760;
  local_334 = local_75c;
  local_800 = local_7f0;
  local_780 = &local_770;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_800,"");
  CLI::std::vector<CLI::Validator,_std::allocator<CLI::Validator>_>::_M_insert_rval
            (pvVar3,(pvVar3->super__Vector_base<CLI::Validator,_std::allocator<CLI::Validator>_>).
                    _M_impl.super__Vector_impl_data._M_start,(value_type *)&local_398);
  if (local_7f8 != 0) {
    local_6e0[0] = local_6d0;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_6e0,local_800,local_7f8 + (long)local_800);
    addLoggingCLI();
  }
  if (local_800 != local_7f0) {
    operator_delete(local_800,local_7f0[0] + 1);
  }
  pAVar1 = local_6f0;
  if (local_358 != &local_348) {
    operator_delete(local_358,local_348._M_allocated_capacity + 1);
  }
  if (local_368 != (code *)0x0) {
    (*local_368)(&local_378,&local_378,__destroy_functor);
  }
  if (local_388 != (_Manager_type)0x0) {
    (*local_388)(&local_398,&local_398,__destroy_functor);
  }
  if (local_780 != &local_770) {
    operator_delete(local_780,
                    CONCAT44(local_770._M_allocated_capacity._4_4_,
                             local_770._M_allocated_capacity._0_4_) + 1);
  }
  if (local_790 != (code *)0x0) {
    (*local_790)(&local_7a0,&local_7a0,__destroy_functor);
  }
  if (local_7b0 != (_Manager_type)0x0) {
    (*local_7b0)(&local_7c0,&local_7c0,__destroy_functor);
  }
  if (local_158.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_158.super__Function_base._M_manager)
              ((_Any_data *)&local_158,(_Any_data *)&local_158,__destroy_functor);
  }
  if (local_138.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_138.super__Function_base._M_manager)
              ((_Any_data *)&local_138,(_Any_data *)&local_138,__destroy_functor);
  }
  if ((_Manager_type *)local_7e0._M_unused._0_8_ != &local_7d0) {
    operator_delete(local_7e0._M_unused._M_object,(ulong)(local_7d0 + 1));
  }
  if (local_518 != &local_508) {
    operator_delete(local_518,local_508._M_allocated_capacity + 1);
  }
  if (local_528 != (code *)0x0) {
    (*local_528)(&local_538,&local_538,__destroy_functor);
  }
  if (local_548 != (code *)0x0) {
    (*local_548)(&local_558,&local_558,__destroy_functor);
  }
  if (local_718 != &local_708) {
    operator_delete(local_718,
                    CONCAT44(local_708._M_allocated_capacity._4_4_,
                             local_708._M_allocated_capacity._0_4_) + 1);
  }
  if (local_728 != (code *)0x0) {
    (*local_728)(&local_738,&local_738,__destroy_functor);
  }
  if (local_748 != (code *)0x0) {
    (*local_748)(&local_758,&local_758,__destroy_functor);
  }
  if (local_118.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_118.super__Function_base._M_manager)
              ((_Any_data *)&local_118,(_Any_data *)&local_118,__destroy_functor);
  }
  if (local_f8.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_f8.super__Function_base._M_manager)
              ((_Any_data *)&local_f8,(_Any_data *)&local_f8,__destroy_functor);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_660._M_dataplus._M_p != &local_660.field_2) {
    operator_delete(local_660._M_dataplus._M_p,local_660.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_298._M_dataplus._M_p != &local_298.field_2) {
    operator_delete(local_298._M_dataplus._M_p,local_298.field_2._M_allocated_capacity + 1);
  }
  local_2b8._M_dataplus._M_p = (pointer)&local_2b8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2b8,"--consoleloglevel","");
  local_680._M_dataplus._M_p = (pointer)&local_680.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_680,"the level at which messages get sent to the file","");
  pOVar2 = CLI::App::add_option<int,_int,_(CLI::detail::enabler)0>
                     (pAVar1,&local_2b8,&this->consoleLogLevel,&local_680);
  local_6c0 = (unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
               *)gLogLevelMap_abi_cxx11_;
  local_178.super__Function_base._M_functor._8_8_ = 0;
  local_178.super__Function_base._M_functor._M_unused._M_object = CLI::ignore_case;
  local_178._M_invoker =
       CLI::std::
       _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(*)(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
       ::_M_invoke;
  local_178.super__Function_base._M_manager =
       CLI::std::
       _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(*)(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
       ::_M_manager;
  local_198.super__Function_base._M_functor._8_8_ = 0;
  local_198.super__Function_base._M_functor._M_unused._M_object = CLI::ignore_underscore;
  local_198._M_invoker =
       CLI::std::
       _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(*)(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
       ::_M_invoke;
  local_198.super__Function_base._M_manager =
       CLI::std::
       _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(*)(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
       ::_M_manager;
  CLI::CheckedTransformer::
  CheckedTransformer<std::unordered_map<std::__cxx11::string,int,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,int>>>const*>
            ((CheckedTransformer *)&local_758,&local_6c0,&local_178,&local_198);
  local_408._M_unused._M_object = (void *)0x0;
  local_408._8_8_ = 0;
  local_3f8 = (code *)0x0;
  local_3f0 = uStack_740;
  if (local_748 != (code *)0x0) {
    local_408._M_unused._M_object = local_758._M_unused._M_object;
    local_408._8_8_ = local_758._8_8_;
    local_3f8 = local_748;
    local_748 = (code *)0x0;
    uStack_740 = 0;
  }
  local_3e8._M_unused._M_object = (void *)0x0;
  local_3e8._8_8_ = 0;
  local_3d8 = (code *)0x0;
  local_3d0 = uStack_720;
  if (local_728 != (code *)0x0) {
    local_3e8._M_unused._M_object = local_738._M_unused._M_object;
    local_3e8._8_8_ = local_738._8_8_;
    local_3d8 = local_728;
    local_728 = (code *)0x0;
    uStack_720 = 0;
  }
  if (local_718 == &local_708) {
    local_3b8._8_4_ = local_708._8_4_;
    local_3b8._12_4_ = local_708._12_4_;
    local_3c8 = &local_3b8;
  }
  else {
    local_3c8 = local_718;
  }
  local_3b8._M_allocated_capacity._4_4_ = local_708._M_allocated_capacity._4_4_;
  local_3b8._M_allocated_capacity._0_4_ = local_708._M_allocated_capacity._0_4_;
  local_3c0 = local_710;
  local_710 = 0;
  local_708._M_allocated_capacity._0_4_ = local_708._M_allocated_capacity._0_4_ & 0xffffff00;
  local_3a8 = local_6f8;
  local_3a4 = local_6f4;
  local_7e0._M_unused._M_object = &local_7d0;
  local_718 = &local_708;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_7e0,"");
  pvVar3 = &pOVar2->validators_;
  CLI::std::vector<CLI::Validator,_std::allocator<CLI::Validator>_>::_M_insert_rval
            (pvVar3,(pOVar2->validators_).
                    super__Vector_base<CLI::Validator,_std::allocator<CLI::Validator>_>._M_impl.
                    super__Vector_impl_data._M_start,(value_type *)&local_408);
  if (local_7e0._8_8_ != 0) {
    local_5e0 = (pvVar3->super__Vector_base<CLI::Validator,_std::allocator<CLI::Validator>_>).
                _M_impl.super__Vector_impl_data._M_start;
    local_7c0._M_unused._M_object = &local_7b0;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_7c0,local_7e0._M_unused._M_object,
               local_7e0._8_8_ + (long)local_7e0._M_unused._0_8_);
    addLoggingCLI();
  }
  local_6e8 = (unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
               *)gLogLevelMap_abi_cxx11_;
  local_1b8.super__Function_base._M_functor._8_8_ = 0;
  local_1b8.super__Function_base._M_functor._M_unused._M_object = CLI::ignore_case;
  local_1b8._M_invoker =
       CLI::std::
       _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(*)(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
       ::_M_invoke;
  local_1b8.super__Function_base._M_manager =
       CLI::std::
       _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(*)(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
       ::_M_manager;
  local_1d8.super__Function_base._M_functor._8_8_ = 0;
  local_1d8.super__Function_base._M_functor._M_unused._M_object = CLI::ignore_underscore;
  local_1d8._M_invoker =
       CLI::std::
       _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(*)(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
       ::_M_invoke;
  local_1d8.super__Function_base._M_manager =
       CLI::std::
       _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(*)(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
       ::_M_manager;
  CLI::IsMember::
  IsMember<std::unordered_map<std::__cxx11::string,int,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,int>>>const*>
            ((IsMember *)&local_7c0,&local_6e8,&local_1b8,&local_1d8);
  local_478._M_unused._M_object = (_Manager_type *)0x0;
  local_478._8_8_ = 0;
  local_468 = (_Manager_type)0x0;
  local_460 = uStack_7a8;
  if (local_7b0 != (_Manager_type)0x0) {
    local_478._M_unused._M_object = local_7c0._M_unused._M_object;
    local_478._8_8_ = local_7c0._8_8_;
    local_468 = local_7b0;
    local_7b0 = (_Manager_type)0x0;
    uStack_7a8 = 0;
  }
  local_458._M_unused._M_object = (void *)0x0;
  local_458._8_8_ = 0;
  local_448 = (code *)0x0;
  local_440 = uStack_788;
  if (local_790 != (code *)0x0) {
    local_458._M_unused._M_object = local_7a0._M_unused._M_object;
    local_458._8_8_ = local_7a0._8_8_;
    local_448 = local_790;
    local_790 = (code *)0x0;
    uStack_788 = 0;
  }
  if (local_780 == &local_770) {
    local_428._8_4_ = local_770._8_4_;
    local_428._12_4_ = local_770._12_4_;
    local_438 = &local_428;
  }
  else {
    local_438 = local_780;
  }
  local_428._M_allocated_capacity._4_4_ = local_770._M_allocated_capacity._4_4_;
  local_428._M_allocated_capacity._0_4_ = local_770._M_allocated_capacity._0_4_;
  local_430 = local_778;
  local_778 = 0;
  local_770._M_allocated_capacity._0_4_ = local_770._M_allocated_capacity._0_4_ & 0xffffff00;
  local_418 = local_760;
  local_414 = local_75c;
  local_800 = local_7f0;
  local_780 = &local_770;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_800,"");
  CLI::std::vector<CLI::Validator,_std::allocator<CLI::Validator>_>::_M_insert_rval
            (pvVar3,(pvVar3->super__Vector_base<CLI::Validator,_std::allocator<CLI::Validator>_>).
                    _M_impl.super__Vector_impl_data._M_start,(value_type *)&local_478);
  if (local_7f8 != 0) {
    local_6e0[0] = local_6d0;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_6e0,local_800,local_7f8 + (long)local_800);
    addLoggingCLI();
  }
  if (local_800 != local_7f0) {
    operator_delete(local_800,local_7f0[0] + 1);
  }
  pAVar1 = local_6f0;
  if (local_438 != &local_428) {
    operator_delete(local_438,local_428._M_allocated_capacity + 1);
  }
  if (local_448 != (code *)0x0) {
    (*local_448)(&local_458,&local_458,__destroy_functor);
  }
  if (local_468 != (_Manager_type)0x0) {
    (*local_468)(&local_478,&local_478,__destroy_functor);
  }
  if (local_780 != &local_770) {
    operator_delete(local_780,
                    CONCAT44(local_770._M_allocated_capacity._4_4_,
                             local_770._M_allocated_capacity._0_4_) + 1);
  }
  if (local_790 != (code *)0x0) {
    (*local_790)(&local_7a0,&local_7a0,__destroy_functor);
  }
  if (local_7b0 != (_Manager_type)0x0) {
    (*local_7b0)(&local_7c0,&local_7c0,__destroy_functor);
  }
  if (local_1d8.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_1d8.super__Function_base._M_manager)
              ((_Any_data *)&local_1d8,(_Any_data *)&local_1d8,__destroy_functor);
  }
  if (local_1b8.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_1b8.super__Function_base._M_manager)
              ((_Any_data *)&local_1b8,(_Any_data *)&local_1b8,__destroy_functor);
  }
  if ((_Manager_type *)local_7e0._M_unused._0_8_ != &local_7d0) {
    operator_delete(local_7e0._M_unused._M_object,(ulong)(local_7d0 + 1));
  }
  if (local_3c8 != &local_3b8) {
    operator_delete(local_3c8,local_3b8._M_allocated_capacity + 1);
  }
  if (local_3d8 != (code *)0x0) {
    (*local_3d8)(&local_3e8,&local_3e8,__destroy_functor);
  }
  if (local_3f8 != (code *)0x0) {
    (*local_3f8)(&local_408,&local_408,__destroy_functor);
  }
  if (local_718 != &local_708) {
    operator_delete(local_718,
                    CONCAT44(local_708._M_allocated_capacity._4_4_,
                             local_708._M_allocated_capacity._0_4_) + 1);
  }
  if (local_728 != (code *)0x0) {
    (*local_728)(&local_738,&local_738,__destroy_functor);
  }
  if (local_748 != (code *)0x0) {
    (*local_748)(&local_758,&local_758,__destroy_functor);
  }
  if (local_198.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_198.super__Function_base._M_manager)
              ((_Any_data *)&local_198,(_Any_data *)&local_198,__destroy_functor);
  }
  if (local_178.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_178.super__Function_base._M_manager)
              ((_Any_data *)&local_178,(_Any_data *)&local_178,__destroy_functor);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_680._M_dataplus._M_p != &local_680.field_2) {
    operator_delete(local_680._M_dataplus._M_p,local_680.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2b8._M_dataplus._M_p != &local_2b8.field_2) {
    operator_delete(local_2b8._M_dataplus._M_p,local_2b8.field_2._M_allocated_capacity + 1);
  }
  local_758._M_unused._M_member_pointer = 10;
  fmt.size_ = 4;
  fmt.data_ = (char *)0x11;
  args.field_1.args_ = in_R9.args_;
  args.desc_ = (unsigned_long_long)&local_758;
  ::fmt::v11::vformat_abi_cxx11_(&local_1f8,(v11 *)"--logbuffer{{{}}}",fmt,args);
  local_6a0.super__Function_base._M_functor._8_8_ = 0;
  local_6a0._M_invoker =
       CLI::std::
       _Function_handler<void_(long),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/core/LogManager.cpp:197:13)>
       ::_M_invoke;
  local_6a0.super__Function_base._M_manager =
       CLI::std::
       _Function_handler<void_(long),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/core/LogManager.cpp:197:13)>
       ::_M_manager;
  local_6a0.super__Function_base._M_functor._M_unused._M_object = this;
  local_5d8._M_dataplus._M_p = (pointer)&local_5d8.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_5d8,
             "optionally specify the size of the circular buffer for storing log messages for later retrieval "
             ,"");
  pOVar2 = CLI::App::add_flag_function(pAVar1,(string *)&local_1f8,&local_6a0,&local_5d8);
  pOVar2->expected_min_ = 0;
  pOVar2->expected_max_ = 1;
  if ((pOVar2->super_OptionBase<CLI::Option>).multi_option_policy_ != TakeLast) {
    (pOVar2->super_OptionBase<CLI::Option>).multi_option_policy_ = TakeLast;
    pOVar2->current_option_state_ = parsing;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5d8._M_dataplus._M_p != &local_5d8.field_2) {
    operator_delete(local_5d8._M_dataplus._M_p,local_5d8.field_2._M_allocated_capacity + 1);
  }
  if (local_6a0.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_6a0.super__Function_base._M_manager)
              ((_Any_data *)&local_6a0,(_Any_data *)&local_6a0,__destroy_functor);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
    operator_delete(local_1f8._M_dataplus._M_p,local_1f8.field_2._M_allocated_capacity + 1);
  }
  local_50._8_8_ = 0;
  local_38 = CLI::std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/core/LogManager.cpp:201:29)>
             ::_M_invoke;
  local_40 = CLI::std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/core/LogManager.cpp:201:29)>
             ::_M_manager;
  local_50._M_unused._M_object = this;
  std::function<void_()>::operator=
            ((function<void_()> *)
             ((long)&(pAVar1->parse_complete_callback_).super__Function_base._M_functor +
             (ulong)((pAVar1->immediate_callback_ ^ 1) << 5)),(function<void_()> *)&local_50);
  if (local_40 != (code *)0x0) {
    (*local_40)((_Any_data *)&local_50,(_Any_data *)&local_50,__destroy_functor);
  }
  return;
}

Assistant:

void LogManager::addLoggingCLI(std::shared_ptr<helicsCLI11App>& app)
{
    auto* logging_group =
        app->add_option_group("logging", "Options related to file and message logging");
    logging_group->add_flag_function(
        "--force_logging_flush",
        [this](int64_t val) {
            if (val > 0) {
                forceLoggingFlush = true;
            }
        },
        "flush the log after every message");
    logging_group->add_option("--logfile", logFile, "the file to log the messages to");
    logging_group
        ->add_option_function<int>(
            "--loglevel",
            [this](int val) { setLogLevel(val); },
            "the level at which to log, the higher this is set the more gets logged; set to \"no_print\" for no logging")
        ->envname("HELICS_BROKER_LOG_LEVEL")

        ->transform(
            CLI::CheckedTransformer(&gLogLevelMap, CLI::ignore_case, CLI::ignore_underscore))
        ->transform(CLI::IsMember(&gLogLevelMap, CLI::ignore_case, CLI::ignore_underscore));

    logging_group
        ->add_option("--fileloglevel",
                     fileLogLevel,
                     "the level at which messages get sent to the file")
        ->transform(
            CLI::CheckedTransformer(&gLogLevelMap, CLI::ignore_case, CLI::ignore_underscore))
        ->transform(CLI::IsMember(&gLogLevelMap, CLI::ignore_case, CLI::ignore_underscore));
    logging_group
        ->add_option("--consoleloglevel",
                     consoleLogLevel,
                     "the level at which messages get sent to the file")

        ->transform(
            CLI::CheckedTransformer(&gLogLevelMap, CLI::ignore_case, CLI::ignore_underscore))
        ->transform(CLI::IsMember(&gLogLevelMap, CLI::ignore_case, CLI::ignore_underscore));
    logging_group
        ->add_flag_function(
            fmt::format("--logbuffer{{{}}}", LogBuffer::cDefaultBufferSize),
            [this](std::int64_t val) { mLogBuffer.resize(val); },
            "optionally specify the size of the circular buffer for storing log messages for later retrieval ")
        ->expected(0, 1)
        ->multi_option_policy(CLI::MultiOptionPolicy::TakeLast);
    logging_group->callback([this]() { updateMaxLogLevel(); });
}